

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O2

int Abc_CommandAbc9Posplit(Abc_Frame_t *pAbc,int argc,char **argv)

{
  int iVar1;
  uint nVars;
  Aig_Man_t *p;
  Aig_Man_t *p_00;
  Gia_Man_t *pNew;
  char *pcVar2;
  uint fVerbose;
  int iVar3;
  
  fVerbose = 0;
  Extra_UtilGetoptReset();
  nVars = 5;
  while( true ) {
    while (iVar1 = Extra_UtilGetopt(argc,argv,"Nvh"), iVar3 = globalUtilOptind, iVar1 == 0x76) {
      fVerbose = fVerbose ^ 1;
    }
    if (iVar1 == -1) {
      if (pAbc->pGia != (Gia_Man_t *)0x0) {
        p = Gia_ManToAigSimple(pAbc->pGia);
        p_00 = Aig_ManSplit(p,nVars,fVerbose);
        Aig_ManStop(p);
        if (p_00 == (Aig_Man_t *)0x0) {
          return 0;
        }
        pNew = Gia_ManFromAigSimple(p_00);
        Aig_ManStop(p_00);
        Abc_FrameUpdateGia(pAbc,pNew);
        return 0;
      }
      pcVar2 = "Abc_CommandAbc9Posplit(): There is no AIG.\n";
      iVar3 = -1;
      goto LAB_002578d5;
    }
    if (iVar1 != 0x4e) goto LAB_0025785c;
    if (argc <= globalUtilOptind) break;
    nVars = atoi(argv[globalUtilOptind]);
    globalUtilOptind = iVar3 + 1;
    if ((int)nVars < 0) {
LAB_0025785c:
      iVar3 = -2;
      Abc_Print(-2,"usage: &posplit [-N num] [-vh]\n");
      Abc_Print(-2,"\t         cofactors the property output w.r.t. a support subset\n");
      Abc_Print(-2,"\t         (the OR of new PO functions is equal to the original property)\n");
      Abc_Print(-2,"\t-N num : the number of random cofactoring variables [default = %d]\n",
                (ulong)nVars);
      pcVar2 = "yes";
      if (fVerbose == 0) {
        pcVar2 = "no";
      }
      Abc_Print(-2,"\t-v     : toggle printing verbose information [default = %s]\n",pcVar2);
      pcVar2 = "\t-h     : print the command usage\n";
LAB_002578d5:
      Abc_Print(iVar3,pcVar2);
      return 1;
    }
  }
  Abc_Print(-1,"Command line switch \"-N\" should be followed by an integer.\n");
  goto LAB_0025785c;
}

Assistant:

int Abc_CommandAbc9Posplit( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    extern Aig_Man_t * Aig_ManSplit( Aig_Man_t * p, int nVars, int fVerbose );
    Aig_Man_t * pMan, * pAux;
    Gia_Man_t * pTemp = NULL;
    int c, nVars = 5, fVerbose = 0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "Nvh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'N':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-N\" should be followed by an integer.\n" );
                goto usage;
            }
            nVars = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nVars < 0 )
                goto usage;
            break;
        case 'v':
            fVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( pAbc->pGia == NULL )
    {
        Abc_Print( -1, "Abc_CommandAbc9Posplit(): There is no AIG.\n" );
        return 1;
    }
    pMan = Gia_ManToAigSimple( pAbc->pGia );
    pMan = Aig_ManSplit( pAux = pMan, nVars, fVerbose );
    Aig_ManStop( pAux );
    if ( pMan != NULL )
    {
        pTemp = Gia_ManFromAigSimple( pMan );
        Aig_ManStop( pMan );
        Abc_FrameUpdateGia( pAbc, pTemp );
    }
    return 0;

usage:
    Abc_Print( -2, "usage: &posplit [-N num] [-vh]\n" );
    Abc_Print( -2, "\t         cofactors the property output w.r.t. a support subset\n" );
    Abc_Print( -2, "\t         (the OR of new PO functions is equal to the original property)\n" );
    Abc_Print( -2, "\t-N num : the number of random cofactoring variables [default = %d]\n", nVars );
    Abc_Print( -2, "\t-v     : toggle printing verbose information [default = %s]\n", fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    return 1;
}